

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::Sign(S2Point *a,S2Point *b,S2Point *c)

{
  int iVar1;
  Vector3_d VStack_38;
  
  Vector3<double>::CrossProd(a,b);
  iVar1 = Sign(a,b,c,&VStack_38);
  return iVar1;
}

Assistant:

int Sign(const S2Point& a, const S2Point& b, const S2Point& c) {
  // We don't need RobustCrossProd() here because Sign() does its own
  // error estimation and calls ExpensiveSign() if there is any uncertainty
  // about the result.
  return Sign(a, b, c, a.CrossProd(b));
}